

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

shared_ptr<Debugger> __thiscall
EmmyDebuggerManager::RemoveDebugger(EmmyDebuggerManager *this,lua_State *L)

{
  lua_Hook *__mutex;
  iterator __position;
  lua_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  EmmyDebuggerManager *this_00;
  shared_ptr<Debugger> sVar1;
  UniqueIdentifyType identify;
  UniqueIdentifyType local_30;
  
  __mutex = &L->hook;
  this_00 = (EmmyDebuggerManager *)__mutex;
  std::mutex::lock((mutex *)__mutex);
  local_30 = GetUniqueIdentify(this_00,in_RDX);
  __position = std::
               _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
               ::find((_Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
                       *)(L + 1),&local_30);
  if (__position._M_node == (_Base_ptr)&L[1].tt) {
    (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)
               &__position._M_node[1]._M_parent);
    std::
    _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>,std::_Select1st<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>,std::_Select1st<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
                        *)(L + 1),__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  sVar1.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Debugger>)sVar1.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Debugger> EmmyDebuggerManager::RemoveDebugger(lua_State* L)
{
	std::lock_guard<std::mutex> lock(debuggerMtx);
	auto identify = GetUniqueIdentify(L);
	auto it = debuggers.find(identify);
	if (it != debuggers.end())
	{
		auto debugger = it->second;
		debuggers.erase(it);
		return debugger;
	}
	return nullptr;
}